

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.cpp
# Opt level: O0

void __thiscall Mesh::Mesh(Mesh *this,MeshData *meshData,Texture *texture,GLfloat scale)

{
  GLfloat scale_local;
  Texture *texture_local;
  MeshData *meshData_local;
  Mesh *this_local;
  
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->rotationZ = 0.0;
  this->scale = 0.0;
  this->_scale = 1.0;
  this->_meshData = meshData;
  this->_texture = texture;
  this->_scale = scale;
  return;
}

Assistant:

Mesh::Mesh(MeshData* meshData, Texture* texture, GLfloat scale) {
    _meshData = meshData;
    _texture = texture;
    _scale = scale;
}